

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinaryConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryConditionalDirectiveExpressionSyntax,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&>
          (BumpAllocator *this,ConditionalDirectiveExpressionSyntax *args,Token *args_1,
          ConditionalDirectiveExpressionSyntax *args_2)

{
  Token op;
  BinaryConditionalDirectiveExpressionSyntax *pBVar1;
  ConditionalDirectiveExpressionSyntax *in_RCX;
  BumpAllocator *in_RDX;
  BinaryConditionalDirectiveExpressionSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pBVar1 = (BinaryConditionalDirectiveExpressionSyntax *)
           allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  op.info = unaff_retaddr;
  op.kind = (short)in_RDI;
  op._2_1_ = (char)((ulong)in_RDI >> 0x10);
  op.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  op.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::BinaryConditionalDirectiveExpressionSyntax::
  BinaryConditionalDirectiveExpressionSyntax
            (in_RSI,(ConditionalDirectiveExpressionSyntax *)in_RDX,op,in_RCX);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }